

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

void __thiscall ApprovalTests::TestName::setFileName(TestName *this,string *file)

{
  ulong uVar1;
  string *in_RSI;
  TestName *in_RDI;
  string *in_stack_00000010;
  TestName *in_stack_00000018;
  string local_30 [40];
  TestName *this_00;
  
  this_00 = in_RDI;
  ::std::__cxx11::string::operator=((string *)&in_RDI->originalFileName,in_RSI);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    findFileName(in_stack_00000018,in_stack_00000010);
  }
  else {
    handleBoostQuirks_abi_cxx11_(this_00);
  }
  ::std::__cxx11::string::operator=((string *)&in_RDI->fileName,local_30);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TestName::setFileName(const std::string& file)
    {
        originalFileName = file;
        fileName = file.empty() ? handleBoostQuirks() : findFileName(file);
    }